

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

shared_ptr<cppnet::Timer> cppnet::MakeTimer1Sec(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<cppnet::Timer> sVar2;
  TIME_UNIT local_2c;
  element_type local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  TIME_UNIT local_10 [2];
  
  local_10[0] = 0;
  local_10[1] = 0;
  local_2c = TU_MILLISECOND;
  std::make_shared<cppnet::TimerContainer,decltype(nullptr),cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            (&local_28._vptr_Timer,local_10,&local_2c);
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI->_vptr_Timer = local_28._vptr_Timer;
  in_RDI[1]._vptr_Timer = (_func_int **)_Var1._M_pi;
  local_28._vptr_Timer = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  sVar2.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cppnet::Timer>)
         sVar2.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Timer> MakeTimer1Sec() {
    return std::make_shared<TimerContainer>(nullptr, TU_MILLISECOND, TU_SECOND);
}